

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

int64_t get_warp_error(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int ref_width,
                      int ref_height,int ref_stride,uint8_t *dst,int dst_stride,int p_col,int p_row,
                      int p_width,int p_height,int subsampling_x,int subsampling_y,
                      int64_t best_error,uint8_t *segment_map,int segment_map_stride)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int j_1;
  int64_t iVar6;
  int iVar7;
  uint16_t *puVar8;
  long lVar9;
  int iVar10;
  uint16_t *puVar11;
  uint16_t *dst_00;
  int j;
  long lVar12;
  int iVar13;
  int iVar14;
  undefined4 in_stack_00000034;
  undefined4 in_stack_0000003c;
  ConvolveParams conv_params;
  uint16_t tmp [1024];
  uint16_t *local_8f0;
  ConvolveParams local_890;
  uint16_t local_860 [1048];
  
  iVar6 = 0x7fffffffffffffff;
  iVar1 = av1_get_shear_params(wm);
  if (iVar1 != 0) {
    if (use_hbd == 0) {
      local_890.is_compound = 0;
      local_890.use_dist_wtd_comp_avg = 0;
      local_890.dst = (CONV_BUF_TYPE *)0x0;
      local_890.dst_stride = 0;
      local_890.round_0 = 3;
      local_890.round_1 = 0xb;
      local_890.plane = 0;
      local_890.do_average = 0;
      iVar1 = 0;
      iVar6 = 0;
      for (lVar9 = 0; lVar9 < p_row; lVar9 = lVar9 + 0x20) {
        iVar2 = ref_height - (int)lVar9;
        if (p_row < iVar2) {
          iVar2 = p_row;
        }
        iVar10 = 0x20;
        if (iVar2 < 0x20) {
          iVar10 = iVar2;
        }
        iVar14 = ref_width;
        iVar7 = iVar1;
        for (lVar12 = 0; lVar12 < p_col; lVar12 = lVar12 + 0x20) {
          if (*(char *)(CONCAT44(in_stack_0000003c,p_height) + (long)iVar7) != '\0') {
            iVar4 = iVar14;
            if (p_col < iVar14) {
              iVar4 = p_col;
            }
            iVar13 = iVar4;
            if (0x1f < iVar4) {
              iVar13 = 0x20;
            }
            warp_plane(wm,ref,ref_width,ref_height,ref_stride,(uint8_t *)local_860,(int)lVar12,
                       (int)lVar9,iVar13,iVar10,0x20,0,0,&local_890);
            if (iVar4 < 0x20 || iVar2 < 0x20) {
              iVar4 = generic_sad((uint8_t *)local_860,0x20,dst + lVar12,dst_stride,iVar13,iVar10);
              uVar5 = (ulong)iVar4;
            }
            else {
              uVar3 = (*aom_sad32x32)((uint8_t *)local_860,0x20,dst + lVar12,dst_stride);
              uVar5 = (ulong)uVar3;
            }
            iVar6 = iVar6 + uVar5;
            if (CONCAT44(in_stack_00000034,p_width) < iVar6) {
              return 0x7fffffffffffffff;
            }
          }
          iVar14 = iVar14 + -0x20;
          iVar7 = iVar7 + 1;
        }
        dst = dst + (long)dst_stride * 0x20;
        iVar1 = iVar1 + subsampling_x;
      }
    }
    else {
      puVar8 = (uint16_t *)((long)dst * 2);
      local_890.round_0 = 3;
      local_890.round_1 = 0xb;
      if (10 < bd) {
        local_890.round_0 = bd + -7;
        local_890.round_1 = 0x15 - bd;
      }
      local_890.dst = (CONV_BUF_TYPE *)0x0;
      local_890.dst_stride = 0;
      local_890.plane = 0;
      local_890.do_average = 0;
      local_890.is_compound = 0;
      local_890.use_dist_wtd_comp_avg = 0;
      iVar1 = 0;
      iVar6 = 0;
      puVar11 = puVar8;
      for (lVar9 = 0; lVar9 < p_row; lVar9 = lVar9 + 0x20) {
        iVar2 = ref_height - (int)lVar9;
        if (p_row < iVar2) {
          iVar2 = p_row;
        }
        iVar10 = 0x20;
        if (iVar2 < 0x20) {
          iVar10 = iVar2;
        }
        dst_00 = puVar11;
        iVar14 = ref_width;
        local_8f0 = puVar8;
        iVar7 = iVar1;
        for (lVar12 = 0; lVar12 < p_col; lVar12 = lVar12 + 0x20) {
          if (*(char *)(CONCAT44(in_stack_0000003c,p_height) + (long)iVar7) != '\0') {
            iVar4 = iVar14;
            if (p_col < iVar14) {
              iVar4 = p_col;
            }
            iVar13 = iVar4;
            if (0x1f < iVar4) {
              iVar13 = 0x20;
            }
            highbd_warp_plane(wm,(uint16_t *)((long)ref * 2),ref_width,ref_height,ref_stride,
                              local_860,(int)lVar12,(int)lVar9,iVar13,iVar10,0x20,0,0,bd,&local_890)
            ;
            if (iVar4 < 0x20 || iVar2 < 0x20) {
              iVar4 = generic_sad_highbd(local_860,0x20,dst_00,dst_stride,iVar13,iVar10);
              uVar5 = (ulong)iVar4;
            }
            else {
              uVar3 = (*aom_highbd_sad32x32)
                                ((uint8_t *)((ulong)local_860 >> 1),0x20,
                                 (uint8_t *)((ulong)local_8f0 >> 1),dst_stride);
              uVar5 = (ulong)uVar3;
            }
            iVar6 = iVar6 + uVar5;
            if (CONCAT44(in_stack_00000034,p_width) < iVar6) {
              return 0x7fffffffffffffff;
            }
          }
          local_8f0 = local_8f0 + 0x20;
          dst_00 = dst_00 + 0x20;
          iVar14 = iVar14 + -0x20;
          iVar7 = iVar7 + 1;
        }
        puVar8 = puVar8 + (long)dst_stride * 0x20;
        puVar11 = puVar11 + (long)dst_stride * 0x20;
        iVar1 = iVar1 + subsampling_x;
      }
    }
  }
  return iVar6;
}

Assistant:

static int64_t get_warp_error(WarpedMotionParams *wm, int use_hbd, int bd,
                              const uint8_t *ref, int ref_width, int ref_height,
                              int ref_stride, uint8_t *dst, int dst_stride,
                              int p_col, int p_row, int p_width, int p_height,
                              int subsampling_x, int subsampling_y,
                              int64_t best_error, uint8_t *segment_map,
                              int segment_map_stride) {
  if (!av1_get_shear_params(wm)) return INT64_MAX;
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    return highbd_warp_error(wm, CONVERT_TO_SHORTPTR(ref), ref_width,
                             ref_height, ref_stride, CONVERT_TO_SHORTPTR(dst),
                             dst_stride, p_col, p_row, p_width, p_height,
                             subsampling_x, subsampling_y, bd, best_error,
                             segment_map, segment_map_stride);
#endif
  (void)use_hbd;
  (void)bd;
  return warp_error(wm, ref, ref_width, ref_height, ref_stride, dst, dst_stride,
                    p_col, p_row, p_width, p_height, subsampling_x,
                    subsampling_y, best_error, segment_map, segment_map_stride);
}